

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseOffsetOpt(WastParser *this,Address *out_offset)

{
  Location loc;
  bool bVar1;
  Result result;
  size_type sVar2;
  const_pointer pvVar3;
  ParseIntType in_R8D;
  undefined8 in_R9;
  string_view v;
  undefined1 local_78 [8];
  string_view sv;
  uint64_t offset64;
  Token token;
  Address *out_offset_local;
  WastParser *this_local;
  
  token.field_2.literal_.text._M_str = (char *)out_offset;
  bVar1 = PeekMatch(this,OffsetEqNat,0);
  if (bVar1) {
    Consume((Token *)&offset64,this);
    _local_78 = Token::text((Token *)&offset64);
    v._M_str = (char *)&sv._M_str;
    v._M_len = sv._M_len;
    result = ParseInt64((wabt *)local_78,v,(uint64_t *)0x1,in_R8D);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
      loc.filename._M_str = (char *)token.loc.filename._M_len;
      loc.filename._M_len = offset64;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename._M_str;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid offset \"%.*s\"",sVar2 & 0xffffffff,pvVar3,token.loc.filename._M_str,
            in_R9);
    }
    bVar1 = Features::memory64_enabled((Features *)this->options_);
    if ((!bVar1) && ((char *)0xffffffff < sv._M_str)) {
      Error(this,0x375553);
    }
    *(char **)token.field_2.literal_.text._M_str = sv._M_str;
    this_local._7_1_ = true;
  }
  else {
    *(char *)((long)token.field_2.literal_.text._M_str + 0) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 1) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 2) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 3) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 4) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 5) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 6) = '\0';
    *(char *)((long)token.field_2.literal_.text._M_str + 7) = '\0';
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseOffsetOpt(Address* out_offset) {
  WABT_TRACE(ParseOffsetOpt);
  if (PeekMatch(TokenType::OffsetEqNat)) {
    Token token = Consume();
    uint64_t offset64;
    std::string_view sv = token.text();
    if (Failed(ParseInt64(sv, &offset64, ParseIntType::SignedAndUnsigned))) {
      Error(token.loc, "invalid offset \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }
    // With memory64, offsets > UINT32_MAX for i32 memories are no longer
    // malformed (just invalid)
    if ((!options_->features.memory64_enabled()) && (offset64 > UINT32_MAX)) {
      Error(token.loc, "offset must be less than or equal to 0xffffffff");
    }
    *out_offset = offset64;
    return true;
  } else {
    *out_offset = 0;
    return false;
  }
}